

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseDelphiCoverage.cxx
# Opt level: O3

bool __thiscall
cmParseDelphiCoverage::LoadCoverageData
          (cmParseDelphiCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmParseDelphiCoverage cVar1;
  cmCTest *this_00;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  string path;
  ostringstream cmCTestLog_msg;
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_198 [6];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  local_1e8._M_string_length = 0;
  local_1e8.field_2._M_local_buf[0] = '\0';
  lVar4 = (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    do {
      std::__cxx11::string::_M_assign((string *)&local_1e8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Reading HTML File ",0x12);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,local_1e8._M_string_length
                         );
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      this_00 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmParseDelphiCoverage.cxx"
                   ,0xd8,(char *)local_1c8,this->Coverage->Quiet);
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8,local_1b8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      cmsys::SystemTools::GetFilenameLastExtension((string *)local_1a8,&local_1e8);
      iVar2 = std::__cxx11::string::compare((char *)local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._0_8_ != aaStack_198) {
        operator_delete((void *)local_1a8._0_8_,aaStack_198[0]._M_allocated_capacity + 1);
      }
      if (iVar2 == 0) {
        local_1a8._0_8_ = &PTR__HTMLParser_00699840;
        cVar1 = *this;
        local_1a8._8_8_ = cVar1.CTest;
        register0x00001208 = (int)cVar1.Coverage;
        register0x0000120c = cVar1.Coverage._4_4_;
        HTMLParser::ParseFile((HTMLParser *)local_1a8,local_1e8._M_dataplus._M_p);
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,
                      CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                               local_1e8.field_2._M_local_buf[0]) + 1);
    }
  }
  return true;
}

Assistant:

cmParseDelphiCoverage::cmParseDelphiCoverage(
  cmCTestCoverageHandlerContainer& cont, cmCTest* ctest)
  : Coverage(cont)
  , CTest(ctest)
{
}